

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_rowcol_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  parasail_result_t *ppVar9;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  char *pcVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  char *__format;
  int iVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  undefined1 auVar40 [16];
  uint uVar44;
  uint uVar45;
  uint uVar46;
  undefined1 auVar47 [16];
  uint uVar48;
  uint uVar51;
  uint uVar52;
  undefined1 auVar49 [16];
  uint uVar53;
  undefined1 auVar50 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar58;
  int iVar61;
  int iVar62;
  int iVar63;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  uint local_108;
  int32_t *local_100;
  uint uVar56;
  uint uVar57;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "_s2";
  }
  else {
    uVar28 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar16 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar16 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar16 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_006a9383:
        iVar20 = -open;
        iVar12 = matrix->min;
        uVar8 = 0x80000000 - iVar12;
        if (iVar12 != iVar20 && SBORROW4(iVar12,iVar20) == iVar12 + open < 0) {
          uVar8 = open | 0x80000000;
        }
        uVar17 = 0x7ffffffe - matrix->max;
        ppVar9 = parasail_result_new_rowcol1(_s1Len,s2Len);
        if (ppVar9 != (parasail_result_t *)0x0) {
          ppVar9->flag = ppVar9->flag | 0x4441001;
          uVar14 = (ulong)(s2Len + 6);
          ptr = parasail_memalign_int32_t(0x10,uVar14);
          ptr_00 = parasail_memalign_int32_t(0x10,uVar14);
          ptr_01 = parasail_memalign_int32_t(0x10,uVar14);
          if (ptr_01 != (int32_t *)0x0 && (ptr_00 != (int32_t *)0x0 && ptr != (int32_t *)0x0)) {
            lVar29 = (long)_s1Len;
            if (matrix->type == 0) {
              local_100 = parasail_memalign_int32_t(0x10,(long)(int)(_s1Len + 3));
              uVar14 = 0;
              if (local_100 == (int32_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              uVar15 = 0;
              if (0 < _s1Len) {
                uVar15 = (ulong)(uint)_s1Len;
              }
              for (; lVar10 = lVar29, uVar15 != uVar14; uVar14 = uVar14 + 1) {
                local_100[uVar14] = matrix->mapper[(byte)_s1[uVar14]];
              }
              for (; lVar10 < (int)(_s1Len + 3); lVar10 = lVar10 + 1) {
                local_100[lVar10] = 0;
              }
            }
            else {
              local_100 = (int32_t *)0x0;
            }
            uVar22 = s2Len + 3;
            uVar21 = _s1Len - 1;
            uVar15 = (ulong)uVar21;
            local_108 = s2Len - 1;
            uVar8 = uVar8 + 1;
            auVar37._4_4_ = iVar20 + gap * -2;
            auVar37._0_4_ = gap * -3 - open;
            auVar37._12_4_ = iVar20;
            auVar37._8_4_ = iVar20 - gap;
            piVar2 = matrix->mapper;
            for (uVar14 = 0; uVar28 != uVar14; uVar14 = uVar14 + 1) {
              ptr[uVar14 + 3] = piVar2[(byte)_s2[uVar14]];
            }
            for (lVar10 = 0; uVar14 = uVar28, lVar10 != 3; lVar10 = lVar10 + 1) {
              ptr[lVar10] = 0;
            }
            for (; (int)uVar14 < (int)uVar22; uVar14 = uVar14 + 1) {
              ptr[uVar14 + 3] = 0;
            }
            iVar12 = iVar20;
            for (uVar14 = 0; uVar28 != uVar14; uVar14 = uVar14 + 1) {
              ptr_00[uVar14 + 3] = iVar12;
              ptr_01[uVar14 + 3] = uVar8;
              iVar12 = iVar12 - gap;
            }
            for (lVar10 = 0; uVar14 = uVar28, lVar10 != 3; lVar10 = lVar10 + 1) {
              ptr_00[lVar10] = uVar8;
              ptr_01[lVar10] = uVar8;
            }
            for (; (int)uVar14 < (int)uVar22; uVar14 = uVar14 + 1) {
              ptr_00[uVar14 + 3] = uVar8;
              ptr_01[uVar14 + 3] = uVar8;
            }
            ptr_00[2] = 0;
            uVar14 = (ulong)uVar22;
            if ((int)uVar22 < 1) {
              uVar14 = 0;
            }
            auVar54 = pmovsxbd(in_XMM13,0x10203);
            auVar47._4_4_ = uVar8;
            auVar47._0_4_ = uVar8;
            auVar47._8_4_ = uVar8;
            auVar47._12_4_ = uVar8;
            uVar30 = 0;
            uVar22 = uVar17;
            uVar44 = uVar17;
            uVar45 = uVar17;
            uVar46 = uVar17;
            uVar39 = uVar8;
            uVar41 = uVar8;
            uVar42 = uVar8;
            uVar43 = uVar8;
            while ((long)uVar30 < lVar29) {
              uVar27 = uVar30 | 3;
              uVar19 = (uint)uVar30;
              if (matrix->type == 0) {
                uVar13 = local_100[uVar30 + 1];
                uVar18 = local_100[uVar30 + 2];
                uVar25 = local_100[uVar30];
                uVar24 = local_100[uVar27];
              }
              else {
                uVar13 = uVar21;
                if ((long)(uVar30 | 1) < lVar29) {
                  uVar13 = uVar19 | 1;
                }
                uVar18 = uVar19 | 2;
                if (lVar29 <= (long)(uVar30 | 2)) {
                  uVar18 = uVar21;
                }
                uVar25 = uVar19;
                uVar24 = uVar19 | 3;
                if (lVar29 <= (long)uVar27) {
                  uVar24 = uVar21;
                }
              }
              uVar23 = uVar30 | 1;
              uVar11 = uVar30 | 2;
              piVar2 = matrix->matrix;
              iVar12 = matrix->size;
              auVar32._12_4_ = ptr_00[2];
              auVar32._8_4_ = uVar8;
              auVar32._0_8_ = CONCAT44(uVar8,uVar8);
              auVar49._12_4_ = iVar20 - uVar19 * gap;
              auVar49._8_4_ = uVar8;
              auVar49._0_8_ = CONCAT44(uVar8,uVar8);
              ptr_00[2] = iVar20 - (int)(uVar30 + 4) * gap;
              auVar55._0_4_ = -(uint)(auVar54._0_4_ == uVar21);
              uVar19 = auVar54._4_4_;
              auVar55._4_4_ = -(uint)(uVar19 == uVar21);
              uVar56 = auVar54._8_4_;
              uVar57 = auVar54._12_4_;
              auVar55._8_4_ = -(uint)(uVar56 == uVar21);
              auVar55._12_4_ = -(uint)(uVar57 == uVar21);
              uVar26 = 0;
              auVar36._4_4_ = uVar8;
              auVar36._0_4_ = uVar8;
              auVar36._8_4_ = uVar8;
              auVar36._12_4_ = uVar8;
              auVar60._4_4_ = uVar8;
              auVar60._0_4_ = uVar8;
              auVar60._8_4_ = uVar8;
              auVar60._12_4_ = uVar8;
              in_XMM5 = pmovsxbd(in_XMM5,0xfffefd);
              for (; uVar14 != uVar26; uVar26 = uVar26 + 1) {
                iVar1 = ptr_00[uVar26 + 3];
                iVar64 = auVar49._4_4_ - open;
                iVar65 = auVar49._8_4_ - open;
                iVar66 = auVar49._12_4_ - open;
                iVar67 = iVar1 - open;
                iVar58 = auVar60._4_4_ - gap;
                iVar61 = auVar60._8_4_ - gap;
                iVar62 = auVar60._12_4_ - gap;
                iVar63 = ptr_01[uVar26 + 3] - gap;
                auVar59._0_4_ = (uint)(iVar58 < iVar64) * iVar64 | (uint)(iVar58 >= iVar64) * iVar58
                ;
                auVar59._4_4_ = (uint)(iVar61 < iVar65) * iVar65 | (uint)(iVar61 >= iVar65) * iVar61
                ;
                auVar59._8_4_ = (uint)(iVar62 < iVar66) * iVar66 | (uint)(iVar62 >= iVar66) * iVar62
                ;
                auVar59._12_4_ =
                     (uint)(iVar63 < iVar67) * iVar67 | (uint)(iVar63 >= iVar67) * iVar63;
                iVar64 = auVar49._0_4_ - open;
                iVar65 = auVar49._4_4_ - open;
                iVar66 = auVar49._8_4_ - open;
                iVar67 = auVar49._12_4_ - open;
                iVar58 = auVar36._0_4_ - gap;
                iVar61 = auVar36._4_4_ - gap;
                iVar62 = auVar36._8_4_ - gap;
                iVar63 = auVar36._12_4_ - gap;
                auVar35._0_4_ = (uint)(iVar58 < iVar64) * iVar64 | (uint)(iVar58 >= iVar64) * iVar58
                ;
                auVar35._4_4_ = (uint)(iVar61 < iVar65) * iVar65 | (uint)(iVar61 >= iVar65) * iVar61
                ;
                auVar35._8_4_ = (uint)(iVar62 < iVar66) * iVar66 | (uint)(iVar62 >= iVar66) * iVar62
                ;
                auVar35._12_4_ =
                     (uint)(iVar63 < iVar67) * iVar67 | (uint)(iVar63 >= iVar67) * iVar63;
                iVar58 = piVar2[(long)(int)(uVar24 * iVar12) + (long)ptr[uVar26]] + auVar32._0_4_;
                iVar61 = piVar2[(long)(int)(uVar18 * iVar12) + (long)ptr[uVar26 + 1]] +
                         auVar32._4_4_;
                iVar62 = piVar2[(long)(int)(uVar13 * iVar12) + (long)ptr[uVar26 + 2]] +
                         auVar32._8_4_;
                iVar63 = piVar2[(long)(int)(uVar25 * iVar12) + (long)ptr[uVar26 + 3]] +
                         auVar32._12_4_;
                uVar48 = ((int)auVar35._0_4_ < (int)auVar59._0_4_) * auVar59._0_4_ |
                         ((int)auVar35._0_4_ >= (int)auVar59._0_4_) * auVar35._0_4_;
                uVar51 = ((int)auVar35._4_4_ < (int)auVar59._4_4_) * auVar59._4_4_ |
                         ((int)auVar35._4_4_ >= (int)auVar59._4_4_) * auVar35._4_4_;
                uVar52 = ((int)auVar35._8_4_ < (int)auVar59._8_4_) * auVar59._8_4_ |
                         ((int)auVar35._8_4_ >= (int)auVar59._8_4_) * auVar35._8_4_;
                uVar53 = ((int)auVar35._12_4_ < (int)auVar59._12_4_) * auVar59._12_4_ |
                         ((int)auVar35._12_4_ >= (int)auVar59._12_4_) * auVar35._12_4_;
                auVar50._0_4_ =
                     (uint)((int)uVar48 < iVar58) * iVar58 | ((int)uVar48 >= iVar58) * uVar48;
                auVar50._4_4_ =
                     (uint)((int)uVar51 < iVar61) * iVar61 | ((int)uVar51 >= iVar61) * uVar51;
                auVar50._8_4_ =
                     (uint)((int)uVar52 < iVar62) * iVar62 | ((int)uVar52 >= iVar62) * uVar52;
                auVar50._12_4_ =
                     (uint)((int)uVar53 < iVar63) * iVar63 | ((int)uVar53 >= iVar63) * uVar53;
                uVar48 = in_XMM5._0_4_;
                auVar33._0_4_ = -(uint)(uVar48 == 0xffffffff);
                uVar51 = in_XMM5._4_4_;
                auVar33._4_4_ = -(uint)(uVar51 == 0xffffffff);
                uVar52 = in_XMM5._8_4_;
                uVar53 = in_XMM5._12_4_;
                auVar33._8_4_ = -(uint)(uVar52 == 0xffffffff);
                auVar33._12_4_ = -(uint)(uVar53 == 0xffffffff);
                auVar50 = blendvps(auVar50,auVar37,auVar33);
                auVar5._4_4_ = uVar8;
                auVar5._0_4_ = uVar8;
                auVar5._8_4_ = uVar8;
                auVar5._12_4_ = uVar8;
                auVar60 = blendvps(auVar59,auVar5,auVar33);
                auVar6._4_4_ = uVar8;
                auVar6._0_4_ = uVar8;
                auVar6._8_4_ = uVar8;
                auVar6._12_4_ = uVar8;
                auVar36 = blendvps(auVar35,auVar6,auVar33);
                iVar58 = auVar50._0_4_;
                iVar61 = auVar50._4_4_;
                iVar62 = auVar50._8_4_;
                iVar63 = auVar50._12_4_;
                if (3 < uVar26) {
                  uVar22 = (uint)(iVar58 < (int)uVar22) * iVar58 | (iVar58 >= (int)uVar22) * uVar22;
                  uVar44 = (uint)(iVar61 < (int)uVar44) * iVar61 | (iVar61 >= (int)uVar44) * uVar44;
                  uVar45 = (uint)(iVar62 < (int)uVar45) * iVar62 | (iVar62 >= (int)uVar45) * uVar45;
                  uVar46 = (uint)(iVar63 < (int)uVar46) * iVar63 | (iVar63 >= (int)uVar46) * uVar46;
                  uVar39 = (uint)((int)uVar39 < iVar58) * iVar58 | ((int)uVar39 >= iVar58) * uVar39;
                  uVar41 = (uint)((int)uVar41 < iVar61) * iVar61 | ((int)uVar41 >= iVar61) * uVar41;
                  uVar42 = (uint)((int)uVar42 < iVar62) * iVar62 | ((int)uVar42 >= iVar62) * uVar42;
                  uVar43 = (uint)((int)uVar43 < iVar63) * iVar63 | ((int)uVar43 >= iVar63) * uVar43;
                }
                piVar3 = ((ppVar9->field_4).rowcols)->score_row;
                piVar4 = ((ppVar9->field_4).rowcols)->score_col;
                if (uVar30 == uVar15 && uVar26 < uVar28) {
                  piVar3[uVar26] = iVar63;
                }
                if (local_108 == uVar26) {
                  piVar4[uVar30] = iVar63;
                }
                if (uVar26 - 1 < uVar28 && uVar23 == uVar15) {
                  piVar3[uVar26 - 1] = iVar62;
                }
                if (uVar28 == uVar26 && (long)uVar23 < lVar29) {
                  piVar4[uVar23] = iVar62;
                }
                if ((uVar11 == uVar15) && ((long)(uVar26 - 2) < (long)uVar28 && 1 < uVar26)) {
                  piVar3[uVar26 - 2] = iVar61;
                }
                if (uVar28 + 1 == uVar26 && (long)uVar11 < lVar29) {
                  piVar4[uVar11] = iVar61;
                }
                if (2 < uVar26 && uVar27 == uVar15) {
                  piVar3[uVar26 - 3] = iVar58;
                }
                if (uVar28 + 2 == uVar26 && (long)uVar27 < lVar29) {
                  piVar4[uVar27] = iVar58;
                }
                ptr_00[uVar26] = iVar58;
                auVar34._0_4_ = -(uint)(uVar48 == local_108);
                auVar34._4_4_ = -(uint)(uVar51 == local_108);
                auVar34._8_4_ = -(uint)(uVar52 == local_108);
                auVar34._12_4_ = -(uint)(uVar53 == local_108);
                auVar47 = blendvps(auVar47,auVar50,auVar34 & auVar55);
                ptr_01[uVar26] = auVar60._0_4_;
                in_XMM5._0_4_ = uVar48 + 1;
                in_XMM5._4_4_ = uVar51 + 1;
                in_XMM5._8_4_ = uVar52 + 1;
                in_XMM5._12_4_ = uVar53 + 1;
                auVar32._12_4_ = iVar1;
                auVar32._0_12_ = auVar49._4_12_;
                auVar49 = auVar50;
              }
              auVar54._0_4_ = auVar54._0_4_ + 4;
              auVar54._4_4_ = uVar19 + 4;
              auVar54._8_4_ = uVar56 + 4;
              auVar54._12_4_ = uVar57 + 4;
              auVar38._0_4_ = auVar37._0_4_ + gap * -4;
              auVar38._4_4_ = auVar37._4_4_ + gap * -4;
              auVar38._8_4_ = auVar37._8_4_ + gap * -4;
              auVar38._12_4_ = auVar37._12_4_ + gap * -4;
              uVar30 = uVar30 + 4;
              auVar37 = auVar38;
            }
            iVar12 = 4;
            uVar19 = uVar8;
            while (bVar31 = iVar12 != 0, iVar12 = iVar12 + -1, bVar31) {
              uVar28 = auVar47._0_8_;
              lVar29 = auVar47._8_8_;
              if ((int)uVar19 < (int)auVar47._12_4_) {
                uVar19 = auVar47._12_4_;
              }
              auVar47._0_8_ = uVar28 << 0x20;
              auVar47._8_8_ = lVar29 << 0x20 | uVar28 >> 0x20;
            }
            auVar40._0_4_ = -(uint)((int)uVar17 < (int)uVar39);
            auVar40._4_4_ = -(uint)((int)uVar17 < (int)uVar41);
            auVar40._8_4_ = -(uint)((int)uVar17 < (int)uVar42);
            auVar40._12_4_ = -(uint)((int)uVar17 < (int)uVar43);
            auVar7._4_4_ = -(uint)((int)uVar44 < (int)uVar8);
            auVar7._0_4_ = -(uint)((int)uVar22 < (int)uVar8);
            auVar7._8_4_ = -(uint)((int)uVar45 < (int)uVar8);
            auVar7._12_4_ = -(uint)((int)uVar46 < (int)uVar8);
            iVar12 = movmskps(iVar12,auVar40 | auVar7);
            if (iVar12 != 0) {
              *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
              uVar19 = 0;
              local_108 = 0;
              uVar21 = 0;
            }
            ppVar9->score = uVar19;
            ppVar9->end_query = uVar21;
            ppVar9->end_ref = local_108;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_100);
              return ppVar9;
            }
            return ppVar9;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_006a9383;
        __format = "%s: %s must be > 0\n";
        pcVar16 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_rowcol_diag_sse41_128_32",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMax = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32(vMax, 3);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}